

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlvoid.c
# Opt level: O1

ebml_element * Copy(ebml_element *Element)

{
  ebml_element *peVar1;
  
  peVar1 = EBML_ElementCreate(Element,Element->Context,0,-1);
  if (peVar1 != (ebml_element *)0x0) {
    peVar1->bValueIsSet = Element->bValueIsSet;
    peVar1->DataSize = Element->DataSize;
    peVar1->ElementPosition = Element->ElementPosition;
    peVar1->SizeLength = Element->SizeLength;
    peVar1->SizePosition = Element->SizePosition;
    peVar1->EndPosition = Element->EndPosition;
    peVar1->bNeedDataSizeUpdate = Element->bNeedDataSizeUpdate;
  }
  return peVar1;
}

Assistant:

static ebml_element *Copy(const ebml_element *Element)
{
    ebml_element *Result = EBML_ElementCreate(Element,Element->Context,0,EBML_ANY_PROFILE);
    if (Result)
    {
        Result->bValueIsSet = Element->bValueIsSet;
        Result->DataSize = Element->DataSize;
        Result->ElementPosition = Element->ElementPosition;
        Result->SizeLength = Element->SizeLength;
        Result->SizePosition = Element->SizePosition;
        Result->EndPosition = Element->EndPosition;
        Result->bNeedDataSizeUpdate = Element->bNeedDataSizeUpdate;
    }
    return Result;
}